

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O0

void ft_smooth_lcd_spans(int y,int count,FT_Span *spans,TOrigin *target)

{
  int iVar1;
  uchar *puVar2;
  short local_32;
  uchar *puStack_30;
  unsigned_short w;
  uchar *dst;
  uchar *dst_line;
  TOrigin *target_local;
  FT_Span *spans_local;
  int count_local;
  int y_local;
  
  puVar2 = target->origin;
  iVar1 = target->pitch;
  target_local = (TOrigin *)spans;
  spans_local._0_4_ = count;
  while ((int)spans_local != 0) {
    puStack_30 = puVar2 + ((long)(*(short *)&target_local->origin * 3) - (long)(y * iVar1));
    local_32 = *(short *)((long)&target_local->origin + 2);
    while (local_32 != 0) {
      *puStack_30 = *(uchar *)((long)&target_local->origin + 4);
      puStack_30 = puStack_30 + 3;
      local_32 = local_32 + -1;
    }
    target_local = (TOrigin *)((long)&target_local->origin + 6);
    spans_local._0_4_ = (int)spans_local + -1;
  }
  return;
}

Assistant:

static void
  ft_smooth_lcd_spans( int             y,
                       int             count,
                       const FT_Span*  spans,
                       TOrigin*        target )
  {
    unsigned char*  dst_line = target->origin - y * target->pitch;
    unsigned char*  dst;
    unsigned short  w;


    for ( ; count--; spans++ )
      for ( dst = dst_line + spans->x * 3, w = spans->len; w--; dst += 3 )
        *dst = spans->coverage;
  }